

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O2

void test_ADynArray_reserve_success_enoughCapacityBufferNull_fn(int _i)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  char *expr;
  int line;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  code *local_38;
  code *pcStack_30;
  code *local_28;
  size_t local_20;
  size_t local_18;
  long local_10;
  
  local_38 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_30 = private_ACUtilsTest_ADynArray_free;
  local_20 = 0;
  local_28 = private_ACUtilsTest_ADynArray_growStrategy;
  local_18 = 8;
  local_10 = 0;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  bVar1 = private_ACUtils_ADynArray_reserve(&local_38,8,false,1);
  if (bVar1 == true) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0xdd);
    if (local_20 == 0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0xde);
      if (local_18 == 8) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0xdf);
        if (local_10 == 0) {
          sVar2 = 0;
          pcVar6 = (char *)0x0;
          expr = "Assertion \'_ck_x != NULL\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %#x";
          pcVar4 = "(void*) array.buffer != NULL";
          pcVar5 = "(void*) array.buffer";
          line = 0xe0;
        }
        else {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0xe0);
          if (local_28 == (code *)0x0) {
            sVar2 = 0;
            pcVar6 = (char *)0x0;
            expr = "Assertion \'_ck_x != NULL\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %#x";
            pcVar4 = "(void*) array.growStrategy != NULL";
            pcVar5 = "(void*) array.growStrategy";
            line = 0xe1;
          }
          else {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0xe1);
            if (private_ACUtilsTest_ADynArray_reallocCount == 1) {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0xe2);
              (*pcStack_30)(local_10);
              return;
            }
            pcVar6 = "1";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "private_ACUtilsTest_ADynArray_reallocCount == 1";
            pcVar5 = "private_ACUtilsTest_ADynArray_reallocCount";
            line = 0xe2;
            sVar2 = private_ACUtilsTest_ADynArray_reallocCount;
          }
        }
      }
      else {
        pcVar6 = "private_ACUtilsTest_ADynArray_capacityMin";
        expr = "Assertion \'_ck_x == _ck_y\' failed";
        pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        pcVar4 = "array.capacity == private_ACUtilsTest_ADynArray_capacityMin";
        pcVar5 = "array.capacity";
        line = 0xdf;
        sVar2 = local_18;
      }
    }
    else {
      pcVar6 = "0";
      expr = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar4 = "array.size == 0";
      pcVar5 = "array.size";
      line = 0xde;
      sVar2 = local_20;
    }
  }
  else {
    sVar2 = (size_t)bVar1;
    pcVar6 = "true";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar4 = 
    "private_ACUtils_ADynArray_reserve(&array, array.capacity, false, sizeof(*(&array)->buffer)) == true"
    ;
    pcVar5 = 
    "private_ACUtils_ADynArray_reserve(&array, array.capacity, false, sizeof(*(&array)->buffer))";
    line = 0xdd;
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,line,expr,pcVar3,pcVar4,pcVar5,sVar2,pcVar6);
}

Assistant:

START_TEST(test_ADynArray_reserve_success_enoughCapacityBufferNull)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 0;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = private_ACUtilsTest_ADynArray_capacityMin;
    array.buffer = nullptr;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_reserve(&array, array.capacity), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 0);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 1);
    array.deallocator(array.buffer);
}